

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1d1c3::BuildEngineTest_concurrentProtection_Test::TestBody
          (BuildEngineTest_concurrentProtection_Test *this)

{
  long *plVar1;
  pointer pbVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined8 uVar4;
  SimpleRule *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  _Result_base *p_Var6;
  long lVar7;
  ValueType *value;
  _State_baseV2 *__tmp;
  _func_int **message;
  char *pcVar8;
  _Any_data *update;
  _State_baseV2 *__tmp_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  pointer pbVar10;
  bool bVar11;
  bool started;
  bool done;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  BuildEngine engine;
  unique_lock<std::mutex> lock;
  future<void> build1;
  SimpleBuildEngineDelegate delegate;
  condition_variable done_cv;
  condition_variable started_cv;
  mutex mutex;
  char local_1e2 [2];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  AssertHelper local_1d0;
  undefined1 local_1c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  BuildEngine local_1a0;
  unique_lock<std::mutex> local_198;
  vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_> local_188;
  AssertHelper local_170;
  BuildEngineDelegate local_168;
  ExecutionQueueDelegate local_160;
  undefined1 local_158 [32];
  undefined1 local_138 [17];
  undefined8 uStack_127;
  _Any_data local_118;
  code *local_108;
  undefined8 uStack_100;
  _Any_data local_f8;
  code *local_e8;
  undefined8 uStack_e0;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  condition_variable local_b8 [48];
  condition_variable local_88 [48];
  __native_type local_58;
  
  local_58._16_8_ = 0;
  local_58.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_58.__align = 0;
  local_58._8_8_ = 0;
  local_58.__data.__list.__next = (__pthread_internal_list *)0x0;
  local_1e2[0] = '\0';
  std::condition_variable::condition_variable(local_88);
  local_1e2[1] = 0;
  std::condition_variable::condition_variable(local_b8);
  local_168._vptr_BuildEngineDelegate = (_func_int **)&PTR__SimpleBuildEngineDelegate_00202378;
  local_160.super_ProcessDelegate._vptr_ProcessDelegate =
       (ProcessDelegate)&PTR__ZThn8_N12_GLOBAL__N_125SimpleBuildEngineDelegateD1Ev_002023f8;
  local_158._0_8_ = (pointer)0x0;
  local_158[8] = 0;
  local_158._9_7_ = 0;
  local_158[0x10] = 0;
  local_158._17_8_ = 0;
  local_138._0_8_ = (pointer)0x0;
  local_138[8] = 0;
  local_138._9_7_ = 0;
  local_138[0x10] = 0;
  uStack_127 = 0;
  llbuild::core::BuildEngine::BuildEngine(&local_1a0,&local_168);
  this_00 = (SimpleRule *)operator_new(0xa8);
  local_1c8 = (undefined1  [8])&local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"result","");
  local_188.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_d8._M_unused._M_object = operator_new(0x28);
  *(__native_type **)local_d8._M_unused._0_8_ = &local_58;
  *(char **)((long)local_d8._M_unused._0_8_ + 8) = local_1e2;
  *(condition_variable **)((long)local_d8._M_unused._0_8_ + 0x10) = local_88;
  *(char **)((long)local_d8._M_unused._0_8_ + 0x18) = local_1e2 + 1;
  *(condition_variable **)((long)local_d8._M_unused._0_8_ + 0x20) = local_b8;
  pcStack_c0 = std::
               _Function_handler<int_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:971:19)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<int_(const_std::vector<int,_std::allocator<int>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:971:19)>
             ::_M_manager;
  local_e8 = (code *)0x0;
  uStack_e0 = 0;
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  update = &local_118;
  local_108 = (code *)0x0;
  uStack_100 = 0;
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_1e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  SimpleRule::SimpleRule
            (this_00,(KeyType *)local_1c8,&local_188,(ComputeFnType *)&local_d8,
             (ValidFnType *)&local_f8,(StatusFnType *)update,(CommandSignature *)&local_1e0);
  local_198._M_device = (mutex_type *)this_00;
  llbuild::core::BuildEngine::addRule
            (&local_1a0,
             (unique_ptr<llbuild::core::Rule,_std::default_delete<llbuild::core::Rule>_> *)
             &local_198);
  if ((SimpleRule *)local_198._M_device != (SimpleRule *)0x0) {
    (*((Rule *)&(local_198._M_device)->super___mutex_base)->_vptr_Rule[1])();
  }
  local_198._M_device = (mutex_type *)0x0;
  if (local_108 != (code *)0x0) {
    (*local_108)(&local_118,&local_118,__destroy_functor);
  }
  if (local_e8 != (code *)0x0) {
    (*local_e8)(&local_f8,&local_f8,__destroy_functor);
  }
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::~vector(&local_188);
  if (local_1c8 != (undefined1  [8])&local_1b8) {
    operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
  }
  local_1c8 = (undefined1  [8])0x0;
  _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x50);
  pbVar5->_M_string_length = 0x100000001;
  (pbVar5->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_00202b28;
  paVar9 = &pbVar5->field_2;
  *(_Atomic_word *)&pbVar5[1]._M_string_length = 0;
  *(undefined8 *)((long)&pbVar5->field_2 + 8) = 0;
  *(undefined8 *)((long)&pbVar5->field_2 + 0xd) = 0;
  pbVar5[1].field_2._M_allocated_capacity = 0;
  *(undefined4 *)((long)&pbVar5[1].field_2 + 8) = 0;
  (pbVar5->field_2)._M_allocated_capacity = (size_type)&PTR___Async_state_impl_00202b60;
  p_Var6 = (_Result_base *)operator_new(0x10);
  *(undefined8 *)p_Var6 = 0;
  *(undefined8 *)(p_Var6 + 8) = 0;
  std::__future_base::_Result_base::_Result_base(p_Var6);
  *(undefined ***)p_Var6 = &PTR__M_destroy_00202cb8;
  pbVar5[2]._M_dataplus._M_p = (pointer)p_Var6;
  pbVar5[2]._M_string_length = (size_type)&local_1a0;
  local_198._M_device = (mutex_type *)0x0;
  local_188.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
  ((_State_baseV2 *)
  local_188.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
  _M_impl.super__Vector_impl_data._M_start)->_vptr__State_baseV2 =
       (_func_int **)&PTR___State_00202b90;
  (((_State_baseV2 *)
   local_188.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
   _M_impl.super__Vector_impl_data._M_start)->_M_result)._M_t.
  super___uniq_ptr_impl<std::__future_base::_Result_base,_std::__future_base::_Result_base::_Deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::__future_base::_Result_base_*,_std::__future_base::_Result_base::_Deleter>
  .super__Head_base<0UL,_std::__future_base::_Result_base_*,_false>._M_head_impl =
       (_Result_base *)paVar9;
  *(code **)&((_State_baseV2 *)
             local_188.
             super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
             _M_impl.super__Vector_impl_data._M_start)->_M_status =
       std::__future_base::
       _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp:983:49)>_>,_void>
       ::_M_run;
  *(undefined8 *)
   &((_State_baseV2 *)
    local_188.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
    _M_impl.super__Vector_impl_data._M_start)->_M_once = 0;
  std::thread::_M_start_thread(&local_198,&local_188,0);
  if ((_State_baseV2 *)
      local_188.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
      _M_impl.super__Vector_impl_data._M_start != (_State_baseV2 *)0x0) {
    (*(*(_func_int ***)
        &(local_188.
          super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
          _M_impl.super__Vector_impl_data._M_start)->key)[1])();
  }
  _Var3._M_pi = _Stack_1c0._M_pi;
  if (pbVar5[1].field_2._M_allocated_capacity != 0) {
    std::terminate();
  }
  pbVar5[1].field_2._M_allocated_capacity = (size_type)local_198._M_device;
  bVar11 = _Stack_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1c8 = (undefined1  [8])paVar9;
  _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar5;
  if (bVar11) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
  }
  if (local_1c8 == (undefined1  [8])0x0) {
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x40)
    ;
    pbVar5->_M_string_length = 0x100000001;
    (pbVar5->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_00202bb8;
    *(_Atomic_word *)&pbVar5[1]._M_string_length = 0;
    *(undefined8 *)((long)&pbVar5->field_2 + 8) = 0;
    *(undefined8 *)((long)&pbVar5->field_2 + 0xd) = 0;
    (pbVar5->field_2)._M_allocated_capacity = (size_type)&PTR___Deferred_state_00202bf0;
    p_Var6 = (_Result_base *)operator_new(0x10);
    *(undefined8 *)p_Var6 = 0;
    *(undefined8 *)(p_Var6 + 8) = 0;
    std::__future_base::_Result_base::_Result_base(p_Var6);
    _Var3._M_pi = _Stack_1c0._M_pi;
    *(undefined ***)p_Var6 = &PTR__M_destroy_00202cb8;
    *(_Result_base **)&pbVar5[1].field_2 = p_Var6;
    *(BuildEngine **)((long)&pbVar5[1].field_2 + 8) = &local_1a0;
    bVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi
             != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_1c8 = (undefined1  [8])&pbVar5->field_2;
    _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pbVar5;
    if (bVar11) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var3._M_pi);
    }
  }
  std::__basic_future<void>::__basic_future
            ((__basic_future<void> *)&local_188,(__state_type *)local_1c8);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1c0._M_pi);
  }
  local_198._M_device = (mutex_type *)&local_58;
  local_198._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_198);
  local_198._M_owns = true;
  if (local_1e2[0] == '\0') {
    do {
      std::condition_variable::wait((unique_lock *)local_88);
    } while (local_1e2[0] != '\x01');
  }
  std::unique_lock<std::mutex>::unlock(&local_198);
  uStack_127 = CONCAT17(1,(undefined7)uStack_127);
  local_1c8 = (undefined1  [8])&local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"result","");
  llbuild::core::BuildEngine::build(&local_1a0,(KeyType *)local_1c8);
  if (local_1c8 != (undefined1  [8])&local_1b8) {
    operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
  }
  local_1d0.data_._0_4_ = 1;
  local_1e0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (CONCAT71(local_138._9_7_,local_138[8]) - local_138._0_8_ >> 5);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)local_1c8,"1U","delegate.errors.size()",(uint *)&local_1d0,
             (unsigned_long *)&local_1e0);
  if (local_1c8[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_1e0);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int **)0x1bf116;
    }
    else {
      message = (_func_int **)((_Alloc_hider *)&(_Stack_1c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,999,(char *)message);
    testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d0);
    if (local_1e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1e0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_1c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_1c0._M_pi);
  }
  lVar7 = std::__cxx11::string::find((char *)local_138._0_8_,0x1c13db,0);
  local_1e0._M_head_impl._0_1_ = (internal)(lVar7 != -1);
  local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (lVar7 == -1) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1c8,(internal *)&local_1e0,
               (AssertionResult *)"delegate.errors[0].find(\"busy\") != std::string::npos","false",
               "true",update->_M_pod_data);
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
               ,1000,(char *)local_1c8);
    testing::internal::AssertHelper::operator=(&local_170,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    if (local_1c8 != (undefined1  [8])&local_1b8) {
      operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_1d0.data_._4_4_,local_1d0.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_1d0.data_._4_4_,local_1d0.data_._0_4_) + 8))();
    }
  }
  pbVar5 = local_1d8;
  if (local_1d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1d8,local_1d8);
  }
  std::unique_lock<std::mutex>::lock(&local_198);
  local_1e2[1] = 1;
  std::unique_lock<std::mutex>::unlock(&local_198);
  std::condition_variable::notify_all();
  if ((_State_baseV2 *)
      local_188.super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
      _M_impl.super__Vector_impl_data._M_start != (_State_baseV2 *)0x0) {
    std::__future_base::_State_baseV2::wait
              ((_State_baseV2 *)
               local_188.
               super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>.
               _M_impl.super__Vector_impl_data._M_start,pbVar5);
    uVar4 = local_138._0_8_;
    pbVar2 = (pointer)CONCAT71(local_138._9_7_,local_138[8]);
    if (pbVar2 != (pointer)local_138._0_8_) {
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_138._0_8_ + 0x10);
      do {
        plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar9 + -1))->_M_dataplus)._M_p;
        if (paVar9 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)plVar1) {
          operator_delete(plVar1,paVar9->_M_allocated_capacity + 1);
        }
        pbVar10 = (pointer)(paVar9 + 1);
        paVar9 = paVar9 + 2;
      } while (pbVar10 != pbVar2);
      local_138[8] = (undefined1)uVar4;
      local_138._9_7_ = SUB87(uVar4,1);
    }
    uStack_127 = uStack_127 & 0xffffffffffffff;
    local_1d0.data_._0_4_ = 1;
    local_1c8 = (undefined1  [8])&local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"result","");
    value = llbuild::core::BuildEngine::build(&local_1a0,(KeyType *)local_1c8);
    local_170.data_._0_4_ = intFromValue(value);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_1e0,"1","intFromValue(engine.build(\"result\"))",(int *)&local_1d0
               ,(int *)&local_170);
    if (local_1c8 != (undefined1  [8])&local_1b8) {
      operator_delete((void *)local_1c8,local_1b8._M_allocated_capacity + 1);
    }
    if (local_1e0._M_head_impl._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)local_1c8);
      if (local_1d8 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = (local_1d8->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
                 ,0x3f4,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1d0,(Message *)local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      if (local_1c8 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_1c8 + 8))();
      }
    }
    if (local_1d8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1d8,local_1d8);
    }
    local_1d0.data_._0_4_ = 0;
    local_1e0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT71(local_138._9_7_,local_138[8]) - local_138._0_8_ >> 5);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_1c8,"0U","delegate.errors.size()",(uint *)&local_1d0,
               (unsigned_long *)&local_1e0);
    if (local_1c8[0] == (string)0x0) {
      testing::Message::Message((Message *)&local_1e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = ((_Alloc_hider *)&(_Stack_1c0._M_pi)->_vptr__Sp_counted_base)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/Core/BuildEngineTest.cpp"
                 ,0x3f5,pcVar8);
      testing::internal::AssertHelper::operator=(&local_1d0,(Message *)&local_1e0);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      if (local_1e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1e0._M_head_impl + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Stack_1c0._M_pi !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_1c0._M_pi);
    }
    if (local_198._M_owns == true) {
      std::unique_lock<std::mutex>::unlock(&local_198);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_188.
        super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_188.
                 super__Vector_base<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    llbuild::core::BuildEngine::~BuildEngine(&local_1a0);
    local_168._vptr_BuildEngineDelegate = (_func_int **)&PTR__SimpleBuildEngineDelegate_00202378;
    local_160.super_ProcessDelegate._vptr_ProcessDelegate =
         (ProcessDelegate)&PTR__ZThn8_N12_GLOBAL__N_125SimpleBuildEngineDelegateD1Ev_002023f8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_158);
    (anonymous_namespace)::SimpleBuildEngineDelegate::~SimpleBuildEngineDelegate(&local_160);
    llbuild::core::BuildEngineDelegate::~BuildEngineDelegate(&local_168);
    std::condition_variable::~condition_variable(local_b8);
    std::condition_variable::~condition_variable(local_88);
    return;
  }
  std::__throw_future_error(3);
}

Assistant:

virtual void error(const Twine& message) override {
    errors.push_back(message.str());
    if (!expectedError) {
      fprintf(stderr, "error: %s\n", message.str().c_str());
      abort();
    }
  }